

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharedRenderingPerfTests.cpp
# Opt level: O0

void __thiscall deqp::egl::anon_unknown_0::TestContext::render(TestContext *this)

{
  GLuint GVar1;
  GLsizei GVar2;
  glVertexAttribPointerFunc p_Var3;
  glDrawElementsFunc p_Var4;
  GLenum err;
  deUint32 err_00;
  deBool dVar5;
  Library *pLVar6;
  reference pvVar7;
  reference pvVar8;
  int local_20;
  int local_1c;
  int callNdx;
  int frameNdx;
  Library *egl;
  TestContext *this_local;
  
  pLVar6 = EglTestContext::getLibrary(this->m_testCtx);
  (*pLVar6->_vptr_Library[0x27])(pLVar6,this->m_eglDisplay,this->m_eglSurface,this->m_eglSurface);
  for (local_1c = 0; local_1c < (this->m_config).frameCount; local_1c = local_1c + 1) {
    (*(this->m_gl).clearColor)(0.75,0.6,0.5,1.0);
    (*(this->m_gl).clear)(0x4100);
    for (local_20 = 0; local_20 < (this->m_config).drawCallCount; local_20 = local_20 + 1) {
      (*(this->m_gl).useProgram)(this->m_program);
      (*(this->m_gl).enableVertexAttribArray)(this->m_coordLoc);
      if (((this->m_config).useCoordBuffer & 1U) == 0) {
        p_Var3 = (this->m_gl).vertexAttribPointer;
        GVar1 = this->m_coordLoc;
        pvVar7 = std::vector<float,_std::allocator<float>_>::operator[](&this->m_coordData,0);
        (*p_Var3)(GVar1,2,0x1406,'\0',0,pvVar7);
      }
      else {
        (*(this->m_gl).bindBuffer)(0x8892,this->m_coordBuffer);
        (*(this->m_gl).vertexAttribPointer)(this->m_coordLoc,2,0x1406,'\0',0,(void *)0x0);
        (*(this->m_gl).bindBuffer)(0x8892,0);
      }
      if (((this->m_config).useTexture & 1U) != 0) {
        (*(this->m_gl).bindTexture)(0xde1,this->m_texture);
        (*(this->m_gl).uniform1i)(this->m_textureLoc,0);
      }
      if (((this->m_config).useIndices & 1U) == 0) {
        (*(this->m_gl).drawArrays)(4,0,(this->m_config).triangleCount);
      }
      else if (((this->m_config).useIndexBuffer & 1U) == 0) {
        p_Var4 = (this->m_gl).drawElements;
        GVar2 = (this->m_config).triangleCount;
        pvVar8 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                           (&this->m_indexData,0);
        (*p_Var4)(4,GVar2,0x1403,pvVar8);
      }
      else {
        (*(this->m_gl).bindBuffer)(0x8893,this->m_indexBuffer);
        (*(this->m_gl).drawElements)(4,(this->m_config).triangleCount,0x1403,(void *)0x0);
      }
      if (((this->m_config).useTexture & 1U) != 0) {
        (*(this->m_gl).bindTexture)(0xde1,0);
      }
      (*(this->m_gl).disableVertexAttribArray)(this->m_coordLoc);
      (*(this->m_gl).useProgram)(0);
    }
    (*pLVar6->_vptr_Library[0x31])(pLVar6,this->m_eglDisplay,this->m_eglSurface);
  }
  (*(this->m_gl).finish)();
  err = (*(this->m_gl).getError)();
  glu::checkError(err,"glFinish()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharedRenderingPerfTests.cpp"
                  ,0x2c9);
  do {
    (*pLVar6->_vptr_Library[0x27])(pLVar6,this->m_eglDisplay,0,0);
    err_00 = (*pLVar6->_vptr_Library[0x1f])();
    eglu::checkError(err_00,
                     "makeCurrent(m_eglDisplay, EGL_NO_SURFACE, EGL_NO_SURFACE, EGL_NO_CONTEXT)",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharedRenderingPerfTests.cpp"
                     ,0x2ca);
    dVar5 = ::deGetFalse();
  } while (dVar5 != 0);
  return;
}

Assistant:

void TestContext::render (void)
{
	const Library&	egl	= m_testCtx.getLibrary();

	egl.makeCurrent(m_eglDisplay, m_eglSurface, m_eglSurface, m_eglContext);

	for (int frameNdx = 0; frameNdx < m_config.frameCount; frameNdx++)
	{
		m_gl.clearColor(0.75f, 0.6f, 0.5f, 1.0f);
		m_gl.clear(GL_COLOR_BUFFER_BIT|GL_DEPTH_BUFFER_BIT);

		for (int callNdx = 0; callNdx < m_config.drawCallCount; callNdx++)
		{
			m_gl.useProgram(m_program);
			m_gl.enableVertexAttribArray(m_coordLoc);

			if (m_config.useCoordBuffer)
			{
				m_gl.bindBuffer(GL_ARRAY_BUFFER, m_coordBuffer);
				m_gl.vertexAttribPointer(m_coordLoc, 2, GL_FLOAT, GL_FALSE, 0, 0);
				m_gl.bindBuffer(GL_ARRAY_BUFFER, 0);
			}
			else
				m_gl.vertexAttribPointer(m_coordLoc, 2, GL_FLOAT, GL_FALSE, 0, &(m_coordData[0]));

			if (m_config.useTexture)
			{
				m_gl.bindTexture(GL_TEXTURE_2D, m_texture);
				m_gl.uniform1i(m_textureLoc, 0);
			}

			if (m_config.useIndices)
			{
				if (m_config.useIndexBuffer)
				{
					m_gl.bindBuffer(GL_ELEMENT_ARRAY_BUFFER, m_indexBuffer);
					m_gl.drawElements(GL_TRIANGLES, m_config.triangleCount, GL_UNSIGNED_SHORT, 0);
				}
				else
					m_gl.drawElements(GL_TRIANGLES, m_config.triangleCount, GL_UNSIGNED_SHORT, &(m_indexData[0]));
			}
			else
				m_gl.drawArrays(GL_TRIANGLES, 0, m_config.triangleCount);


			if (m_config.useTexture)
				m_gl.bindTexture(GL_TEXTURE_2D, 0);

			m_gl.disableVertexAttribArray(m_coordLoc);

			m_gl.useProgram(0);
		}


		egl.swapBuffers(m_eglDisplay, m_eglSurface);
	}

	m_gl.finish();
	GLU_EXPECT_NO_ERROR(m_gl.getError(), "glFinish()");
	EGLU_CHECK_CALL(egl, makeCurrent(m_eglDisplay, EGL_NO_SURFACE, EGL_NO_SURFACE, EGL_NO_CONTEXT));
}